

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.cpp
# Opt level: O0

size_t convert<long_long>(char *buf,longlong value)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  char *in_RSI;
  char *in_RDI;
  int lsd;
  char *p;
  longlong i;
  char *local_20;
  
  pcVar3 = in_RDI;
  pcVar1 = in_RSI;
  do {
    local_20 = pcVar3;
    lVar2 = (long)pcVar1 % 10;
    pcVar1 = (char *)((long)pcVar1 / 10);
    pcVar3 = local_20 + 1;
    *local_20 = zero[(int)lVar2];
  } while (pcVar1 != (char *)0x0);
  if ((long)in_RSI < 0) {
    *pcVar3 = '-';
    pcVar3 = local_20 + 2;
  }
  local_20 = pcVar3;
  *local_20 = '\0';
  std::reverse<char*>(in_RSI,(char *)0x0);
  return (long)local_20 - (long)in_RDI;
}

Assistant:

size_t convert(char buf[], T value){
    T i = value;
    char* p=buf;

    do{
        int lsd=static_cast<int>(i%10);
        i /=10;
        *p++ = zero[lsd];
    }while(i!=0);

    if(value<0){
        *p++ = '-';
    }
    *p = '\0';
    std::reverse(buf, p);

    return p-buf;
}